

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

mbedtls_cipher_info_t * mbedtls_cipher_info_from_string(char *cipher_name)

{
  int iVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t **ppmVar3;
  
  if (cipher_name == (char *)0x0) {
LAB_001e9d04:
    pmVar2 = (mbedtls_cipher_info_t *)0x0;
  }
  else {
    ppmVar3 = &mbedtls_cipher_definitions[0].info;
    do {
      pmVar2 = *ppmVar3;
      if (pmVar2 == (mbedtls_cipher_info_t *)0x0) goto LAB_001e9d04;
      iVar1 = strcmp(pmVar2->name,cipher_name);
      ppmVar3 = ppmVar3 + 2;
    } while (iVar1 != 0);
  }
  return pmVar2;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_string(
    const char *cipher_name)
{
    const mbedtls_cipher_definition_t *def;

    if (NULL == cipher_name) {
        return NULL;
    }

    for (def = mbedtls_cipher_definitions; def->info != NULL; def++) {
        if (!strcmp(def->info->name, cipher_name)) {
            return def->info;
        }
    }

    return NULL;
}